

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>const>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,Matrix<double,__1,__1,_0,__1,__1> *lhs,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               *rhs,Scalar *alpha)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  NestedExpressionType pMVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  ActualRhsType actualRhs;
  RhsNested actual_rhs;
  double *local_80 [2];
  const_blas_data_mapper<double,_long,_1> local_70;
  const_blas_data_mapper<double,_long,_0> local_60;
  DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
  local_50 [8];
  long local_48;
  double local_38;
  NestedExpressionType local_30;
  
  if ((lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 1)
  {
    pdVar2 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar3 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
    if (lVar3 < 0 && pdVar2 != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                   );
    }
    pMVar4 = (rhs->m_expression).m_rhs.m_expression;
    if (lVar3 != (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows) {
      __assert_fail("size() == other.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Dot.h"
                    ,0x52,
                    "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, OtherDerived = Eigen::Block<const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>>, -1, 1, true>]"
                   );
    }
    if (lVar3 == 0) {
      dVar7 = 0.0;
    }
    else {
      if (lVar3 < 1) {
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                      ,0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      dVar1 = (rhs->m_expression).m_lhs.m_functor.m_other;
      pdVar5 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      dVar7 = (dVar1 / *pdVar5) * *pdVar2;
      if (lVar3 != 1) {
        lVar6 = 1;
        do {
          dVar7 = dVar7 + (dVar1 / pdVar5[lVar6]) * pdVar2[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
      }
    }
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    *pdVar2 = *alpha * dVar7 + *pdVar2;
  }
  else {
    local_48 = (rhs->m_expression).m_lhs.m_rows.m_value;
    local_38 = (rhs->m_expression).m_lhs.m_functor.m_other;
    local_30 = (rhs->m_expression).m_rhs.m_expression;
    PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_80,local_50);
    local_60.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride =
         (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_60.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    local_70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = local_80[0];
    local_70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(local_60.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride,
          (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols,
          &local_60,&local_70,
          (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,1,
          *alpha);
    free(local_80[0]);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }